

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::ast::NetAlias>::reallocateTo
          (SmallVectorBase<slang::ast::NetAlias> *this,size_type newCapacity)

{
  NetAlias *__last;
  iterator ctx;
  NetAlias *in_RSI;
  SmallVectorBase<slang::ast::NetAlias> *in_RDI;
  pointer newData;
  
  __last = (NetAlias *)operator_new(0x102ad16);
  begin(in_RDI);
  ctx = end(in_RDI);
  std::uninitialized_move<slang::ast::NetAlias*,slang::ast::NetAlias*>
            (in_RSI,__last,(NetAlias *)in_RDI);
  cleanup(in_RDI,(EVP_PKEY_CTX *)ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }